

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall
vkb::detail::GenericFeatureChain::find_and_match
          (GenericFeatureChain *this,GenericFeatureChain *extensions_requested)

{
  bool bVar1;
  bool bVar2;
  reference requested;
  reference supported;
  GenericFeaturesPNextNode *supported_node;
  const_iterator __end3;
  const_iterator __begin3;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range3;
  bool found;
  GenericFeaturesPNextNode *requested_extension_node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range2;
  GenericFeatureChain *extensions_requested_local;
  GenericFeatureChain *this_local;
  
  __end2 = std::
           vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ::begin(&extensions_requested->nodes);
  requested_extension_node =
       (GenericFeaturesPNextNode *)
       std::
       vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
       ::end(&extensions_requested->nodes);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                                *)&requested_extension_node);
    if (!bVar1) {
      return true;
    }
    requested = __gnu_cxx::
                __normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                ::operator*(&__end2);
    bVar1 = false;
    __end3 = std::
             vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
             ::begin(&this->nodes);
    supported_node =
         (GenericFeaturesPNextNode *)
         std::
         vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
         ::end(&this->nodes);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                                       *)&supported_node), bVar2) {
      supported = __gnu_cxx::
                  __normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                  ::operator*(&__end3);
      if (supported->sType == requested->sType) {
        bVar1 = true;
        bVar2 = GenericFeaturesPNextNode::match(requested,supported);
        if (!bVar2) {
          return false;
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
      ::operator++(&__end3);
    }
    if (!bVar1) {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool GenericFeatureChain::find_and_match(GenericFeatureChain const& extensions_requested) const noexcept {
    for (const auto& requested_extension_node : extensions_requested.nodes) {
        bool found = false;
        for (const auto& supported_node : nodes) {
            if (supported_node.sType == requested_extension_node.sType) {
                found = true;
                if (!GenericFeaturesPNextNode::match(requested_extension_node, supported_node)) return false;
                break;
            }
        }
        if (!found) return false;
    }
    return true;
}